

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_table_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  __m256i a;
  __m256i alVar24;
  __m256i alVar25;
  __m256i alVar26;
  __m256i alVar27;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  __m256i vH_03;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  uint uVar32;
  int iVar33;
  uint seglen;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  __m256i *ptr_06;
  __m256i *ptr_07;
  __m256i *ptr_08;
  __m256i *ptr_09;
  __m256i *ptr_10;
  __m256i *ptr_11;
  __m256i *ptr_12;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  int32_t temp;
  int32_t column_len;
  int32_t *l;
  int32_t *s;
  int32_t *m;
  int32_t *t;
  __m256i vCompare;
  __m256i cond_max;
  __m256i vFtL;
  __m256i vFtS;
  __m256i vFtM;
  __m256i vFt;
  __m256i vGapperL_1;
  __m256i vGapper_1;
  __m256i case0;
  __m256i case2;
  __m256i case1;
  __m256i vWS;
  __m256i *pvWS;
  __m256i vWM;
  __m256i *pvWM;
  __m256i vW;
  __m256i *pvW;
  __m256i vHpL;
  __m256i vHpS;
  __m256i vHpM;
  __m256i vHp;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_opn;
  __m256i vF_ext;
  __m256i vF;
  __m256i vHtL;
  __m256i vHtS;
  __m256i vHtM;
  __m256i vHt;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_opn;
  __m256i vE_ext;
  __m256i vE;
  __m256i vGapperL;
  __m256i vGapper;
  parasail_result_t *result;
  __m256i vSegLen;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vMaxHUnit;
  __m256i vMaxL;
  __m256i vMaxS;
  __m256i vMaxM;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int32_t length;
  int32_t similar;
  int32_t matches;
  int32_t score;
  __m256i vOne;
  __m256i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapperL;
  __m256i *pvGapper;
  __m256i *pvHLMax;
  __m256i *pvHSMax;
  __m256i *pvHMMax;
  __m256i *pvHMax;
  __m256i *pvHL;
  __m256i *pvHS;
  __m256i *pvHM;
  __m256i *pvH;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvPs;
  __m256i *pvPm;
  __m256i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  undefined4 in_stack_ffffffffffffd420;
  uint in_stack_ffffffffffffd424;
  int32_t dlen;
  uint d;
  uint t_00;
  uint uVar42;
  uint uVar43;
  int *in_stack_ffffffffffffd460;
  __m256i *palVar44;
  __m256i *local_2b98;
  __m256i *in_stack_ffffffffffffd470;
  __m256i *palVar45;
  __m256i *local_2b88;
  long lStack_2b68;
  __m256i local_2960;
  __m256i local_2940;
  __m256i local_2920;
  __m256i local_2900;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  longlong local_2720;
  longlong lStack_2718;
  longlong lStack_2710;
  longlong lStack_2708;
  longlong local_2700;
  longlong lStack_26f8;
  longlong lStack_26f0;
  longlong lStack_26e8;
  longlong local_26e0;
  longlong lStack_26d8;
  longlong lStack_26d0;
  longlong lStack_26c8;
  longlong local_2680;
  longlong lStack_2678;
  longlong lStack_2670;
  longlong lStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_25c0 [32];
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  int local_2470;
  int local_246c;
  int local_2468;
  uint local_2464;
  int local_2324;
  int local_2320;
  int local_231c;
  uint local_2318;
  parasail_result_t *local_22f8;
  ulong uStack_22b8;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_avx2_256_32","profile")
    ;
    local_22f8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x48) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_avx2_256_32",
            "profile->profile32.score");
    local_22f8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_avx2_256_32",
            "profile->matrix");
    local_22f8 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_scan_profile_avx2_256_32",
            "profile->s1Len");
    local_22f8 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_avx2_256_32","s2");
    local_22f8 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_scan_profile_avx2_256_32",
            "s2Len");
    local_22f8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_scan_profile_avx2_256_32",
            "open");
    local_22f8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_scan_profile_avx2_256_32","gap"
           );
    local_22f8 = (parasail_result_t *)0x0;
  }
  else {
    local_2324 = 0;
    local_2320 = *(int *)(in_RDI + 8);
    lVar4 = *(long *)(in_RDI + 0x10);
    uVar32 = (local_2320 + 7) / 8;
    lVar5 = *(long *)(in_RDI + 0x48);
    lVar6 = *(long *)(in_RDI + 0x50);
    lVar7 = *(long *)(in_RDI + 0x58);
    auVar8 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar8 = vpinsrd_avx(auVar8,in_ECX,2);
    auVar8 = vpinsrd_avx(auVar8,in_ECX,3);
    auVar39 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar39 = vpinsrd_avx(auVar39,in_ECX,2);
    auVar39 = vpinsrd_avx(auVar39,in_ECX,3);
    uStack_330 = auVar39._0_8_;
    uStack_328 = auVar39._8_8_;
    auVar39 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar39 = vpinsrd_avx(auVar39,in_R8D,2);
    auVar39 = vpinsrd_avx(auVar39,in_R8D,3);
    auVar37 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar37 = vpinsrd_avx(auVar37,in_R8D,2);
    auVar37 = vpinsrd_avx(auVar37,in_R8D,3);
    auVar37 = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar37;
    auVar39 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
    uStack_2f0 = auVar39._0_8_;
    uStack_2e8 = auVar39._8_8_;
    if ((int)-in_ECX < *(int *)(lVar4 + 0x20)) {
      iVar33 = in_ECX + 0x80000000;
    }
    else {
      iVar33 = -0x80000000 - *(int *)(lVar4 + 0x20);
    }
    local_2464 = iVar33 + 1;
    seglen = 0x7ffffffe - *(int *)(lVar4 + 0x1c);
    uStack_22b8 = SUB328(ZEXT832(0),4);
    dlen = 1;
    auVar39 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar39 = vpinsrd_avx(auVar39,1,2);
    auVar39 = vpinsrd_avx(auVar39,1,3);
    auVar9 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar9 = vpinsrd_avx(auVar9,1,2);
    auVar9 = vpinsrd_avx(auVar9,1,3);
    uStack_2b0 = auVar9._0_8_;
    uStack_2a8 = auVar9._8_8_;
    local_2468 = 0;
    local_246c = 0;
    local_2470 = 0;
    auVar9 = vpinsrd_avx(ZEXT416(local_2464),local_2464,1);
    auVar9 = vpinsrd_avx(auVar9,local_2464,2);
    auVar9 = vpinsrd_avx(auVar9,local_2464,3);
    auVar40 = vpinsrd_avx(ZEXT416(local_2464),local_2464,1);
    auVar40 = vpinsrd_avx(auVar40,local_2464,2);
    auVar40 = vpinsrd_avx(auVar40,local_2464,3);
    uStack_270 = auVar40._0_8_;
    uStack_268 = auVar40._8_8_;
    auVar10 = vpinsrd_avx(ZEXT416(seglen),seglen,1);
    auVar10 = vpinsrd_avx(auVar10,seglen,2);
    auVar10 = vpinsrd_avx(auVar10,seglen,3);
    auVar38 = vpinsrd_avx(ZEXT416(seglen),seglen,1);
    auVar38 = vpinsrd_avx(auVar38,seglen,2);
    auVar38 = vpinsrd_avx(auVar38,seglen,3);
    uStack_230 = auVar38._0_8_;
    uStack_228 = auVar38._8_8_;
    local_24e0._16_8_ = uStack_230;
    local_24e0._0_16_ = auVar10;
    local_24e0._24_8_ = uStack_228;
    local_2500._16_8_ = uStack_270;
    local_2500._0_16_ = auVar9;
    local_2500._24_8_ = uStack_268;
    local_2520._16_8_ = uStack_270;
    local_2520._0_16_ = auVar9;
    local_2520._24_8_ = uStack_268;
    local_2540._16_8_ = uStack_270;
    local_2540._0_16_ = auVar9;
    local_2540._24_8_ = uStack_268;
    local_2560._16_8_ = uStack_270;
    local_2560._0_16_ = auVar9;
    local_2560._24_8_ = uStack_268;
    local_2580._16_8_ = uStack_270;
    local_2580._0_16_ = auVar9;
    local_2580._24_8_ = uStack_268;
    auVar38 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
    auVar38 = vpinsrd_avx(auVar38,uVar32,2);
    auVar38 = vpinsrd_avx(auVar38,uVar32,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
    auVar11 = vpinsrd_avx(auVar11,uVar32,2);
    auVar11 = vpinsrd_avx(auVar11,uVar32,3);
    auVar13._16_16_ = auVar11;
    auVar13._0_16_ = auVar38;
    auVar38 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
    auVar38 = vpinsrd_avx(auVar38,uVar32,2);
    auVar38 = vpinsrd_avx(auVar38,uVar32,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
    auVar11 = vpinsrd_avx(auVar11,uVar32,2);
    auVar11 = vpinsrd_avx(auVar11,uVar32,3);
    auVar22._16_16_ = auVar11;
    auVar22._0_16_ = auVar38;
    auVar38 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
    auVar38 = vpinsrd_avx(auVar38,uVar32,2);
    auVar38 = vpinsrd_avx(auVar38,uVar32,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
    auVar11 = vpinsrd_avx(auVar11,uVar32,2);
    vpinsrd_avx(auVar11,uVar32,3);
    auVar22 = vperm2i128_avx2(ZEXT1632(auVar38),auVar22,0x28);
    auVar13 = vpalignr_avx2(auVar13,auVar22,0xc);
    local_25c0 = ZEXT832(uStack_22b8) << 0x40;
    auVar21 = vpblendd_avx2(local_25c0,ZEXT432(local_2464),1);
    uVar34 = -uVar32 * in_R8D;
    auVar38 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
    auVar38 = vpinsrd_avx(auVar38,uVar34,2);
    auVar38 = vpinsrd_avx(auVar38,uVar34,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
    auVar11 = vpinsrd_avx(auVar11,uVar34,2);
    auVar11 = vpinsrd_avx(auVar11,uVar34,3);
    auVar23._16_16_ = auVar11;
    auVar23._0_16_ = auVar38;
    uVar35 = -uVar32 * in_R8D;
    auVar38 = vpinsrd_avx(ZEXT416(uVar35),uVar35,1);
    auVar38 = vpinsrd_avx(auVar38,uVar35,2);
    auVar38 = vpinsrd_avx(auVar38,uVar35,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar35),uVar35,1);
    auVar11 = vpinsrd_avx(auVar11,uVar35,2);
    auVar11 = vpinsrd_avx(auVar11,uVar35,3);
    auVar19._16_16_ = auVar11;
    auVar19._0_16_ = auVar38;
    uVar36 = -uVar32 * in_R8D;
    auVar38 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
    auVar38 = vpinsrd_avx(auVar38,uVar36,2);
    auVar38 = vpinsrd_avx(auVar38,uVar36,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
    auVar11 = vpinsrd_avx(auVar11,uVar36,2);
    vpinsrd_avx(auVar11,uVar36,3);
    auVar22 = vperm2i128_avx2(ZEXT1632(auVar38),auVar19,0x28);
    auVar22 = vpalignr_avx2(auVar23,auVar22,0xc);
    auVar22 = vpaddd_avx2(auVar21,auVar22);
    d = local_2464;
    t_00 = uVar32;
    uVar42 = uVar32;
    uVar43 = uVar32;
    local_22f8 = parasail_result_new_table3(uVar32 * 8,in_EDX);
    if (local_22f8 == (parasail_result_t *)0x0) {
      local_22f8 = (parasail_result_t *)0x0;
    }
    else {
      local_22f8->flag = local_22f8->flag | 0x8410404;
      local_22f8->flag = local_22f8->flag | 0x20000;
      ptr = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_00 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_01 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_02 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_03 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_04 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_05 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_06 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_07 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_08 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_09 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_10 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_11 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      ptr_12 = parasail_memalign___m256i(0x20,(long)(int)uVar32);
      if (ptr == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_02 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_03 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_04 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_05 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_06 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_07 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_08 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_09 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_10 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_11 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else if (ptr_12 == (__m256i *)0x0) {
        local_22f8 = (parasail_result_t *)0x0;
      }
      else {
        alVar24[0]._4_4_ = uVar43;
        alVar24[0]._0_4_ = uVar42;
        alVar24[1]._0_4_ = uVar34;
        alVar24[1]._4_4_ = uVar35;
        alVar24[2]._0_4_ = uVar36;
        alVar24[2]._4_4_ = iVar33;
        alVar24[3]._0_4_ = in_ECX;
        alVar24[3]._4_4_ = in_R8D;
        parasail_memset___m256i(in_stack_ffffffffffffd470,alVar24,CONCAT44(t_00,seglen));
        alVar25[0]._4_4_ = uVar43;
        alVar25[0]._0_4_ = uVar42;
        alVar25[1]._0_4_ = uVar34;
        alVar25[1]._4_4_ = uVar35;
        alVar25[2]._0_4_ = uVar36;
        alVar25[2]._4_4_ = iVar33;
        alVar25[3]._0_4_ = in_ECX;
        alVar25[3]._4_4_ = in_R8D;
        parasail_memset___m256i(in_stack_ffffffffffffd470,alVar25,CONCAT44(t_00,seglen));
        alVar26[0]._4_4_ = uVar43;
        alVar26[0]._0_4_ = uVar42;
        alVar26[1]._0_4_ = uVar34;
        alVar26[1]._4_4_ = uVar35;
        alVar26[2]._0_4_ = uVar36;
        alVar26[2]._4_4_ = iVar33;
        alVar26[3]._0_4_ = in_ECX;
        alVar26[3]._4_4_ = in_R8D;
        parasail_memset___m256i(in_stack_ffffffffffffd470,alVar26,CONCAT44(t_00,seglen));
        alVar27[0]._4_4_ = uVar43;
        alVar27[0]._0_4_ = uVar42;
        alVar27[1]._0_4_ = uVar34;
        alVar27[1]._4_4_ = uVar35;
        alVar27[2]._0_4_ = uVar36;
        alVar27[2]._4_4_ = iVar33;
        alVar27[3]._0_4_ = in_ECX;
        alVar27[3]._4_4_ = in_R8D;
        parasail_memset___m256i(in_stack_ffffffffffffd470,alVar27,CONCAT44(t_00,seglen));
        c[0]._4_4_ = uVar43;
        c[0]._0_4_ = uVar42;
        c[1]._0_4_ = uVar34;
        c[1]._4_4_ = uVar35;
        c[2]._0_4_ = uVar36;
        c[2]._4_4_ = iVar33;
        c[3]._0_4_ = in_ECX;
        c[3]._4_4_ = in_R8D;
        parasail_memset___m256i(in_stack_ffffffffffffd470,c,CONCAT44(t_00,seglen));
        c_00[0]._4_4_ = uVar43;
        c_00[0]._0_4_ = uVar42;
        c_00[1]._0_4_ = uVar34;
        c_00[1]._4_4_ = uVar35;
        c_00[2]._0_4_ = uVar36;
        c_00[2]._4_4_ = iVar33;
        c_00[3]._0_4_ = in_ECX;
        c_00[3]._4_4_ = in_R8D;
        parasail_memset___m256i(in_stack_ffffffffffffd470,c_00,CONCAT44(t_00,seglen));
        c_01[0]._4_4_ = uVar43;
        c_01[0]._0_4_ = uVar42;
        c_01[1]._0_4_ = uVar34;
        c_01[1]._4_4_ = uVar35;
        c_01[2]._0_4_ = uVar36;
        c_01[2]._4_4_ = iVar33;
        c_01[3]._0_4_ = in_ECX;
        c_01[3]._4_4_ = in_R8D;
        parasail_memset___m256i(in_stack_ffffffffffffd470,c_01,CONCAT44(t_00,seglen));
        c_02[0]._4_4_ = uVar43;
        c_02[0]._0_4_ = uVar42;
        c_02[1]._0_4_ = uVar34;
        c_02[1]._4_4_ = uVar35;
        c_02[2]._0_4_ = uVar36;
        c_02[2]._4_4_ = iVar33;
        c_02[3]._0_4_ = in_ECX;
        c_02[3]._4_4_ = in_R8D;
        parasail_memset___m256i(in_stack_ffffffffffffd470,c_02,CONCAT44(t_00,seglen));
        auVar20._16_8_ = uStack_330;
        auVar20._0_16_ = auVar8;
        auVar20._24_8_ = uStack_328;
        local_2640 = vpsubd_avx2(ZEXT832(uStack_22b8) << 0x40,auVar20);
        local_2660._16_8_ = uStack_2b0;
        local_2660._0_16_ = auVar39;
        local_2660._24_8_ = uStack_2a8;
        local_2318 = uVar32;
        while( true ) {
          local_2318 = local_2318 - 1;
          auVar41 = ZEXT3264(auVar20);
          if ((int)local_2318 < 0) break;
          palVar44 = ptr_11 + (int)local_2318;
          (*palVar44)[0] = local_2640._0_8_;
          (*palVar44)[1] = local_2640._8_8_;
          (*palVar44)[2] = local_2640._16_8_;
          (*palVar44)[3] = local_2640._24_8_;
          palVar44 = ptr_12 + (int)local_2318;
          (*palVar44)[0] = local_2660._0_8_;
          (*palVar44)[1] = local_2660._8_8_;
          (*palVar44)[2] = local_2660._16_8_;
          (*palVar44)[3] = local_2660._24_8_;
          auVar16._16_8_ = uStack_2f0;
          auVar16._0_16_ = auVar37;
          auVar16._24_8_ = uStack_2e8;
          local_2640 = vpsubd_avx2(local_2640,auVar16);
          auVar20._16_8_ = uStack_2b0;
          auVar20._0_16_ = auVar39;
          auVar20._24_8_ = uStack_2a8;
          local_2660 = vpaddd_avx2(local_2660,auVar20);
        }
        local_231c = 0;
        auVar38 = auVar9;
        while( true ) {
          uStack_2588 = auVar40._8_8_;
          uStack_2590 = auVar40._0_8_;
          if (in_EDX <= local_231c) break;
          auVar23 = vperm2i128_avx2(auVar41._0_32_,(undefined1  [32])ptr_03[(int)(uVar32 - 1)],0x28)
          ;
          local_2900 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_03[(int)(uVar32 - 1)],auVar23,
                                              0xc);
          auVar23 = vperm2i128_avx2(auVar23,(undefined1  [32])ptr_04[(int)(uVar32 - 1)],0x28);
          local_2920 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_04[(int)(uVar32 - 1)],auVar23,
                                              0xc);
          auVar23 = vperm2i128_avx2(auVar23,(undefined1  [32])ptr_05[(int)(uVar32 - 1)],0x28);
          local_2940 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_05[(int)(uVar32 - 1)],auVar23,
                                              0xc);
          auVar23 = vperm2i128_avx2(auVar23,(undefined1  [32])ptr_06[(int)(uVar32 - 1)],0x28);
          local_2960 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_06[(int)(uVar32 - 1)],auVar23,
                                              0xc);
          iVar1 = *(int *)(*(long *)(lVar4 + 0x10) + (ulong)*(byte *)(in_RSI + local_231c) * 4);
          iVar2 = *(int *)(*(long *)(lVar4 + 0x10) + (ulong)*(byte *)(in_RSI + local_231c) * 4);
          iVar3 = *(int *)(*(long *)(lVar4 + 0x10) + (ulong)*(byte *)(in_RSI + local_231c) * 4);
          local_2740 = ZEXT832(uStack_22b8) << 0x40;
          local_27c0._16_8_ = uStack_270;
          local_27c0._0_16_ = auVar9;
          local_27c0._24_8_ = uStack_268;
          local_2820 = ZEXT832(uStack_22b8) << 0x40;
          local_2840 = ZEXT832(uStack_22b8) << 0x40;
          local_2860 = ZEXT832(uStack_22b8) << 0x40;
          for (local_2318 = 0; (int)local_2318 < (int)uVar32; local_2318 = local_2318 + 1) {
            alVar24 = ptr_03[(int)local_2318];
            alVar25 = ptr_04[(int)local_2318];
            alVar26 = ptr_05[(int)local_2318];
            alVar27 = ptr_06[(int)local_2318];
            auVar15._16_8_ = uStack_330;
            auVar15._0_16_ = auVar8;
            auVar15._24_8_ = uStack_328;
            auVar19 = vpsubd_avx2((undefined1  [32])ptr_03[(int)local_2318],auVar15);
            auVar14._16_8_ = uStack_2f0;
            auVar14._0_16_ = auVar37;
            auVar14._24_8_ = uStack_2e8;
            auVar20 = vpsubd_avx2((undefined1  [32])ptr[(int)local_2318],auVar14);
            auVar23 = vpcmpgtd_avx2(auVar19,auVar20);
            auVar18 = vpmaxsd_avx2(auVar19,auVar20);
            auVar14 = vpblendvb_avx2((undefined1  [32])ptr_00[(int)local_2318],
                                     (undefined1  [32])ptr_04[(int)local_2318],auVar23);
            auVar15 = vpblendvb_avx2((undefined1  [32])ptr_01[(int)local_2318],
                                     (undefined1  [32])ptr_05[(int)local_2318],auVar23);
            auVar23 = vpblendvb_avx2((undefined1  [32])ptr_02[(int)local_2318],
                                     (undefined1  [32])ptr_06[(int)local_2318],auVar23);
            auVar17._16_8_ = uStack_2b0;
            auVar17._0_16_ = auVar39;
            auVar17._24_8_ = uStack_2a8;
            auVar23 = vpaddd_avx2(auVar23,auVar17);
            auVar19 = vpaddd_avx2(local_2740,(undefined1  [32])ptr_11[(int)local_2318]);
            auVar16 = vpcmpgtd_avx2(local_27c0,auVar19);
            auVar20 = vpcmpeqd_avx2(local_27c0,auVar19);
            auVar20 = vpor_avx2(auVar16,auVar20);
            local_27c0 = vpmaxsd_avx2(local_27c0,auVar19);
            local_2820 = vpblendvb_avx2(local_2760,local_2820,auVar20);
            local_2840 = vpblendvb_avx2(local_2780,local_2840,auVar20);
            auVar19 = vpaddd_avx2(local_27a0,(undefined1  [32])ptr_12[(int)local_2318]);
            local_2860 = vpblendvb_avx2(auVar19,local_2860,auVar20);
            auVar19 = vpaddd_avx2((undefined1  [32])local_2900,
                                  *(undefined1 (*) [32])
                                   (lVar5 + (long)(int)(iVar1 * uVar32) * 0x20 +
                                   (long)(int)local_2318 * 0x20));
            auVar20 = vpaddd_avx2((undefined1  [32])local_2920,
                                  *(undefined1 (*) [32])
                                   (lVar6 + (long)(int)(iVar2 * uVar32) * 0x20 +
                                   (long)(int)local_2318 * 0x20));
            auVar16 = vpaddd_avx2((undefined1  [32])local_2940,
                                  *(undefined1 (*) [32])
                                   (lVar7 + (long)(int)(iVar3 * uVar32) * 0x20 +
                                   (long)(int)local_2318 * 0x20));
            auVar12._16_8_ = uStack_2b0;
            auVar12._0_16_ = auVar39;
            auVar12._24_8_ = uStack_2a8;
            auVar12 = vpaddd_avx2((undefined1  [32])local_2960,auVar12);
            local_2680 = auVar18._0_8_;
            lStack_2678 = auVar18._8_8_;
            lStack_2670 = auVar18._16_8_;
            lStack_2668 = auVar18._24_8_;
            local_2900[0] = auVar19._0_8_;
            local_2900[1] = auVar19._8_8_;
            local_2900[2] = auVar19._16_8_;
            local_2900[3] = auVar19._24_8_;
            auVar17 = vpcmpgtd_avx2(auVar18,auVar19);
            local_2740 = vpmaxsd_avx2(auVar18,auVar19);
            local_2920[0] = auVar20._0_8_;
            local_2920[1] = auVar20._8_8_;
            local_2920[2] = auVar20._16_8_;
            local_2920[3] = auVar20._24_8_;
            local_26e0 = auVar14._0_8_;
            lStack_26d8 = auVar14._8_8_;
            lStack_26d0 = auVar14._16_8_;
            lStack_26c8 = auVar14._24_8_;
            local_2760 = vpblendvb_avx2(auVar20,auVar14,auVar17);
            local_2940[0] = auVar16._0_8_;
            local_2940[1] = auVar16._8_8_;
            local_2940[2] = auVar16._16_8_;
            local_2940[3] = auVar16._24_8_;
            local_2700 = auVar15._0_8_;
            lStack_26f8 = auVar15._8_8_;
            lStack_26f0 = auVar15._16_8_;
            lStack_26e8 = auVar15._24_8_;
            local_2780 = vpblendvb_avx2(auVar16,auVar15,auVar17);
            local_2960[0] = auVar12._0_8_;
            local_2960[1] = auVar12._8_8_;
            local_2960[2] = auVar12._16_8_;
            local_2960[3] = auVar12._24_8_;
            local_2720 = auVar23._0_8_;
            lStack_2718 = auVar23._8_8_;
            lStack_2710 = auVar23._16_8_;
            lStack_2708 = auVar23._24_8_;
            local_27a0 = vpblendvb_avx2(auVar12,auVar23,auVar17);
            palVar44 = ptr + (int)local_2318;
            (*palVar44)[0] = local_2680;
            (*palVar44)[1] = lStack_2678;
            (*palVar44)[2] = lStack_2670;
            (*palVar44)[3] = lStack_2668;
            palVar44 = ptr_00 + (int)local_2318;
            (*palVar44)[0] = local_26e0;
            (*palVar44)[1] = lStack_26d8;
            (*palVar44)[2] = lStack_26d0;
            (*palVar44)[3] = lStack_26c8;
            palVar44 = ptr_01 + (int)local_2318;
            (*palVar44)[0] = local_2700;
            (*palVar44)[1] = lStack_26f8;
            (*palVar44)[2] = lStack_26f0;
            (*palVar44)[3] = lStack_26e8;
            palVar44 = ptr_02 + (int)local_2318;
            (*palVar44)[0] = local_2720;
            (*palVar44)[1] = lStack_2718;
            (*palVar44)[2] = lStack_2710;
            (*palVar44)[3] = lStack_2708;
            palVar44 = ptr_03 + (int)local_2318;
            (*palVar44)[0] = local_2900[0];
            (*palVar44)[1] = local_2900[1];
            (*palVar44)[2] = local_2900[2];
            (*palVar44)[3] = local_2900[3];
            palVar44 = ptr_04 + (int)local_2318;
            (*palVar44)[0] = local_2920[0];
            (*palVar44)[1] = local_2920[1];
            (*palVar44)[2] = local_2920[2];
            (*palVar44)[3] = local_2920[3];
            palVar44 = ptr_05 + (int)local_2318;
            (*palVar44)[0] = local_2940[0];
            (*palVar44)[1] = local_2940[1];
            (*palVar44)[2] = local_2940[2];
            (*palVar44)[3] = local_2940[3];
            palVar44 = ptr_06 + (int)local_2318;
            (*palVar44)[0] = local_2960[0];
            (*palVar44)[1] = local_2960[1];
            (*palVar44)[2] = local_2960[2];
            (*palVar44)[3] = local_2960[3];
            local_2960 = alVar27;
            local_2940 = alVar26;
            local_2920 = alVar25;
            local_2900 = alVar24;
          }
          auVar23 = vperm2i128_avx2(auVar23,local_2740,0x28);
          auVar19 = vpalignr_avx2(local_2740,auVar23,0xc);
          auVar23 = vperm2i128_avx2(auVar23,local_2760,0x28);
          local_2760 = vpalignr_avx2(local_2760,auVar23,0xc);
          auVar23 = vperm2i128_avx2(auVar23,local_2780,0x28);
          local_2780 = vpalignr_avx2(local_2780,auVar23,0xc);
          auVar23 = vperm2i128_avx2(auVar23,local_27a0,0x28);
          local_27a0 = vpalignr_avx2(local_27a0,auVar23,0xc);
          auVar23 = vpaddd_avx2(auVar19,(undefined1  [32])*ptr_11);
          auVar16 = vpcmpgtd_avx2(auVar23,local_27c0);
          auVar20 = vpcmpeqd_avx2(auVar23,local_27c0);
          auVar20 = vpor_avx2(auVar16,auVar20);
          local_27c0 = vpmaxsd_avx2(local_27c0,auVar23);
          local_2820 = vpblendvb_avx2(local_2820,local_2760,auVar20);
          local_2840 = vpblendvb_avx2(local_2840,local_2780,auVar20);
          auVar23 = vpaddd_avx2(local_27a0,(undefined1  [32])*ptr_12);
          local_2860 = vpblendvb_avx2(local_2860,auVar23,auVar20);
          for (local_2318 = 0; (int)local_2318 < 6; local_2318 = local_2318 + 1) {
            auVar20 = vperm2i128_avx2(auVar23,local_27c0,0x28);
            auVar23 = vpalignr_avx2(local_27c0,auVar20,0xc);
            auVar16 = vperm2i128_avx2(auVar20,local_2820,0x28);
            auVar20 = vpalignr_avx2(local_2820,auVar16,0xc);
            auVar12 = vperm2i128_avx2(auVar16,local_2840,0x28);
            auVar16 = vpalignr_avx2(local_2840,auVar12,0xc);
            auVar12 = vperm2i128_avx2(auVar12,local_2860,0x28);
            auVar12 = vpalignr_avx2(local_2860,auVar12,0xc);
            auVar23 = vpaddd_avx2(auVar23,auVar22);
            auVar15 = vpcmpgtd_avx2(auVar23,local_27c0);
            auVar14 = vpcmpeqd_avx2(auVar23,local_27c0);
            auVar14 = vpor_avx2(auVar15,auVar14);
            local_27c0 = vpmaxsd_avx2(local_27c0,auVar23);
            local_2820 = vpblendvb_avx2(local_2820,auVar20,auVar14);
            local_2840 = vpblendvb_avx2(local_2840,auVar16,auVar14);
            auVar23 = vpaddd_avx2(auVar12,auVar13);
            local_2860 = vpblendvb_avx2(local_2860,auVar23,auVar14);
          }
          auVar20 = vperm2i128_avx2(auVar23,local_27c0,0x28);
          auVar23 = vpalignr_avx2(local_27c0,auVar20,0xc);
          auVar20 = vperm2i128_avx2(auVar20,local_2820,0x28);
          local_2820 = vpalignr_avx2(local_2820,auVar20,0xc);
          auVar20 = vperm2i128_avx2(auVar20,local_2840,0x28);
          local_2840 = vpalignr_avx2(local_2840,auVar20,0xc);
          auVar20 = vperm2i128_avx2(auVar20,local_2860,0x28);
          local_2860 = vpalignr_avx2(local_2860,auVar20,0xc);
          local_27c0 = vpaddd_avx2(auVar23,auVar21);
          auVar23 = vpcmpgtd_avx2(local_27c0,auVar19);
          local_2880 = vpmaxsd_avx2(local_27c0,auVar19);
          local_28a0 = vpblendvb_avx2(local_2760,local_2820,auVar23);
          local_28c0 = vpblendvb_avx2(local_2780,local_2840,auVar23);
          local_28e0 = vpblendvb_avx2(local_27a0,local_2860,auVar23);
          for (local_2318 = 0; (int)local_2318 < (int)uVar32; local_2318 = local_2318 + 1) {
            auVar29._16_8_ = uStack_330;
            auVar29._0_16_ = auVar8;
            auVar29._24_8_ = uStack_328;
            auVar23 = vpsubd_avx2(local_2880,auVar29);
            auVar28._16_8_ = uStack_2f0;
            auVar28._0_16_ = auVar37;
            auVar28._24_8_ = uStack_2e8;
            auVar19 = vpsubd_avx2(local_27c0,auVar28);
            local_27c0 = vpmaxsd_avx2(auVar23,auVar19);
            auVar23 = vpcmpgtd_avx2(auVar23,auVar19);
            local_2820 = vpblendvb_avx2(local_2820,local_28a0,auVar23);
            local_2840 = vpblendvb_avx2(local_2840,local_28c0,auVar23);
            auVar23 = vpblendvb_avx2(local_2860,local_28e0,auVar23);
            auVar18._16_8_ = uStack_2b0;
            auVar18._0_16_ = auVar39;
            auVar18._24_8_ = uStack_2a8;
            local_2860 = vpaddd_avx2(auVar23,auVar18);
            auVar23 = vpmaxsd_avx2((undefined1  [32])ptr_03[(int)local_2318],
                                   (undefined1  [32])ptr[(int)local_2318]);
            auVar23 = vpmaxsd_avx2(auVar23,local_27c0);
            local_2880 = vpmaxsd_avx2(auVar23,ZEXT832(uStack_22b8) << 0x40);
            auVar19 = vpcmpeqd_avx2(local_2880,(undefined1  [32])ptr_03[(int)local_2318]);
            auVar20 = vpcmpeqd_avx2(local_2880,local_27c0);
            auVar16 = vpcmpeqd_avx2(local_2880,ZEXT832(uStack_22b8) << 0x40);
            auVar23 = vpblendvb_avx2((undefined1  [32])ptr_00[(int)local_2318],local_2820,auVar20);
            auVar23 = vpblendvb_avx2(auVar23,(undefined1  [32])ptr_04[(int)local_2318],auVar19);
            local_28a0 = vpblendvb_avx2(auVar23,ZEXT832(uStack_22b8) << 0x40,auVar16);
            auVar23 = vpblendvb_avx2((undefined1  [32])ptr_01[(int)local_2318],local_2840,auVar20);
            auVar23 = vpblendvb_avx2(auVar23,(undefined1  [32])ptr_05[(int)local_2318],auVar19);
            local_28c0 = vpblendvb_avx2(auVar23,ZEXT832(uStack_22b8) << 0x40,auVar16);
            auVar23 = vpblendvb_avx2((undefined1  [32])ptr_02[(int)local_2318],local_2860,auVar20);
            auVar23 = vpblendvb_avx2(auVar23,(undefined1  [32])ptr_06[(int)local_2318],auVar19);
            local_28e0 = vpblendvb_avx2(auVar23,ZEXT832(uStack_22b8) << 0x40,auVar16);
            palVar44 = ptr_03 + (int)local_2318;
            (*palVar44)[0] = local_2880._0_8_;
            (*palVar44)[1] = local_2880._8_8_;
            (*palVar44)[2] = local_2880._16_8_;
            (*palVar44)[3] = local_2880._24_8_;
            palVar44 = ptr_04 + (int)local_2318;
            (*palVar44)[0] = local_28a0._0_8_;
            (*palVar44)[1] = local_28a0._8_8_;
            (*palVar44)[2] = local_28a0._16_8_;
            (*palVar44)[3] = local_28a0._24_8_;
            palVar44 = ptr_05 + (int)local_2318;
            (*palVar44)[0] = local_28c0._0_8_;
            (*palVar44)[1] = local_28c0._8_8_;
            (*palVar44)[2] = local_28c0._16_8_;
            (*palVar44)[3] = local_28c0._24_8_;
            palVar44 = ptr_06 + (int)local_2318;
            (*palVar44)[0] = local_28e0._0_8_;
            (*palVar44)[1] = local_28e0._8_8_;
            (*palVar44)[2] = local_28e0._16_8_;
            (*palVar44)[3] = local_28e0._24_8_;
            local_24e0 = vpminsd_avx2(local_24e0,local_2880);
            auVar23 = vpmaxsd_avx2(local_2500,local_2880);
            auVar23 = vpmaxsd_avx2(auVar23,local_28a0);
            auVar23 = vpmaxsd_avx2(auVar23,local_28c0);
            local_2500 = vpmaxsd_avx2(auVar23,local_28e0);
            vH_00[0]._4_4_ = uVar43;
            vH_00[0]._0_4_ = uVar42;
            vH_00[1]._0_4_ = uVar34;
            vH_00[1]._4_4_ = uVar35;
            vH_00[2]._0_4_ = uVar36;
            vH_00[2]._4_4_ = iVar33;
            vH_00[3]._0_4_ = in_ECX;
            vH_00[3]._4_4_ = in_R8D;
            arr_store_si256(in_stack_ffffffffffffd460,vH_00,t_00,seglen,d,dlen);
            vH_01[0]._4_4_ = uVar43;
            vH_01[0]._0_4_ = uVar42;
            vH_01[1]._0_4_ = uVar34;
            vH_01[1]._4_4_ = uVar35;
            vH_01[2]._0_4_ = uVar36;
            vH_01[2]._4_4_ = iVar33;
            vH_01[3]._0_4_ = in_ECX;
            vH_01[3]._4_4_ = in_R8D;
            arr_store_si256(in_stack_ffffffffffffd460,vH_01,t_00,seglen,d,dlen);
            vH_02[0]._4_4_ = uVar43;
            vH_02[0]._0_4_ = uVar42;
            vH_02[1]._0_4_ = uVar34;
            vH_02[1]._4_4_ = uVar35;
            vH_02[2]._0_4_ = uVar36;
            vH_02[2]._4_4_ = iVar33;
            vH_02[3]._0_4_ = in_ECX;
            vH_02[3]._4_4_ = in_R8D;
            arr_store_si256(in_stack_ffffffffffffd460,vH_02,t_00,seglen,d,dlen);
            vH_03[0]._4_4_ = uVar43;
            vH_03[0]._0_4_ = uVar42;
            vH_03[1]._0_4_ = uVar34;
            vH_03[1]._4_4_ = uVar35;
            vH_03[2]._0_4_ = uVar36;
            vH_03[2]._4_4_ = iVar33;
            vH_03[3]._0_4_ = in_ECX;
            vH_03[3]._4_4_ = in_R8D;
            arr_store_si256(in_stack_ffffffffffffd460,vH_03,t_00,seglen,d,dlen);
            auVar23 = vpcmpgtd_avx2(local_2880,local_2520);
            local_2520 = vpmaxsd_avx2(local_2880,local_2520);
            local_2540 = vpblendvb_avx2(local_2540,local_28a0,auVar23);
            local_2560 = vpblendvb_avx2(local_2560,local_28c0,auVar23);
            local_2580 = vpblendvb_avx2(local_2580,local_28e0,auVar23);
          }
          auVar31._16_8_ = uStack_2590;
          auVar31._0_16_ = auVar38;
          auVar31._24_8_ = uStack_2588;
          auVar41 = ZEXT3264(auVar31);
          auVar23 = vpcmpgtd_avx2(local_2520,auVar31);
          lStack_2b68 = auVar23._24_8_;
          if ((((((((((((((((((((((((((((((((auVar23 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar23 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar23 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar23 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar23 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar23 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar23 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar23 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar23 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar23 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar23 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar23 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar23 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar23 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar23 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar23 >> 0x7f,0) != '\0') ||
                            (auVar23 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar23 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar23 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar23 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar23 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0xbf,0) != '\0') ||
                    (auVar23 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar23 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar23 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar23 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar23 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_2b68 < 0
             ) {
            a[1]._0_4_ = in_stack_ffffffffffffd420;
            a[0] = 0xd122fb;
            a[1]._4_4_ = in_stack_ffffffffffffd424;
            a[2]._0_4_ = dlen;
            a[2]._4_4_ = d;
            a[3]._0_4_ = seglen;
            a[3]._4_4_ = t_00;
            local_2464 = _mm256_hmax_epi32_rpl(a);
            auVar40 = vpinsrd_avx(ZEXT416(local_2464),local_2464,1);
            auVar40 = vpinsrd_avx(auVar40,local_2464,2);
            auVar11 = vpinsrd_avx(auVar40,local_2464,3);
            auVar40 = vpinsrd_avx(ZEXT416(local_2464),local_2464,1);
            auVar40 = vpinsrd_avx(auVar40,local_2464,2);
            auVar40 = vpinsrd_avx(auVar40,local_2464,3);
            auVar38 = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar40;
            auVar40 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
            local_2324 = local_231c;
            auVar41 = ZEXT1664(auVar11);
            in_stack_ffffffffffffd424 = local_2464;
            memcpy(ptr_07,ptr_03,(long)(int)uVar32 << 5);
            memcpy(ptr_08,ptr_04,(long)(int)uVar32 << 5);
            memcpy(ptr_09,ptr_05,(long)(int)uVar32 << 5);
            memcpy(ptr_10,ptr_06,(long)(int)uVar32 << 5);
          }
          local_231c = local_231c + 1;
        }
        palVar44 = ptr_10;
        local_2b98 = ptr_09;
        palVar45 = ptr_08;
        local_2b88 = ptr_07;
        for (local_2318 = 0; (int)local_2318 < (int)(uVar32 * 8); local_2318 = local_2318 + 1) {
          if (((uint)(*local_2b88)[0] == local_2464) &&
             (iVar33 = (int)local_2318 / 8 + ((int)local_2318 % 8) * uVar32, iVar33 < local_2320)) {
            local_2468 = (int)(*palVar45)[0];
            local_246c = (int)(*local_2b98)[0];
            local_2470 = (int)(*palVar44)[0];
            local_2320 = iVar33;
          }
          local_2b88 = (__m256i *)((long)*local_2b88 + 4);
          palVar45 = (__m256i *)((long)*palVar45 + 4);
          local_2b98 = (__m256i *)((long)*local_2b98 + 4);
          palVar44 = (__m256i *)((long)*palVar44 + 4);
        }
        auVar30._16_8_ = uStack_270;
        auVar30._0_16_ = auVar9;
        auVar30._24_8_ = uStack_268;
        auVar22 = vpcmpgtd_avx2(auVar30,local_24e0);
        auVar21._16_8_ = uStack_230;
        auVar21._0_16_ = auVar10;
        auVar21._24_8_ = uStack_228;
        auVar13 = vpcmpgtd_avx2(local_2500,auVar21);
        auVar22 = vpor_avx2(auVar22,auVar13);
        if ((((((((((((((((((((((((((((((((auVar22 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar22 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar22 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar22 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar22 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar22 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar22 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar22 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar22 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar22 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar22 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar22 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar22 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar22 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar22 >> 0x7f,0) != '\0') ||
                          (auVar22 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar22 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar22 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar22 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar22 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar22 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar22 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar22 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar22 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar22[0x1f] < '\0') {
          local_22f8->flag = local_22f8->flag | 0x40;
          local_2464 = 0;
          local_2468 = 0;
          local_246c = 0;
          local_2470 = 0;
          local_2320 = 0;
          local_2324 = 0;
        }
        local_22f8->score = local_2464;
        local_22f8->end_query = local_2320;
        local_22f8->end_ref = local_2324;
        ((local_22f8->field_4).stats)->matches = local_2468;
        ((local_22f8->field_4).stats)->similar = local_246c;
        ((local_22f8->field_4).stats)->length = local_2470;
        parasail_free(ptr_12);
        parasail_free(ptr_11);
        parasail_free(ptr_10);
        parasail_free(ptr_09);
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return local_22f8;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile32.score;
    pvPm = (__m256i*)profile->profile32.matches;
    pvPs = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi32(segLen), 4);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
            vGapperL = _mm256_add_epi32(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHpM = _mm256_slli_si256_rpl(vHpM, 4);
        vHpS = _mm256_slli_si256_rpl(vHpS, 4);
        vHpL = _mm256_slli_si256_rpl(vHpL, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi32(vH, vGapO);
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            case1 = _mm256_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm256_max_epi32(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi32(vEL, vOne);
            vGapper = _mm256_add_epi32(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vF, vGapper),
                    _mm256_cmpeq_epi32(vF, vGapper));
            vF = _mm256_max_epi32(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi32(vHp, vW);
            vHpM = _mm256_add_epi32(vHpM, vWM);
            vHpS = _mm256_add_epi32(vHpS, vWS);
            vHpL = _mm256_add_epi32(vHpL, vOne);
            case1 = _mm256_cmpgt_epi32(vE, vHp);
            vHt = _mm256_max_epi32(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHtM = _mm256_slli_si256_rpl(vHtM, 4);
        vHtS = _mm256_slli_si256_rpl(vHtS, 4);
        vHtL = _mm256_slli_si256_rpl(vHtL, 4);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi32(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi32(vGapper, vF),
                _mm256_cmpeq_epi32(vGapper, vF));
        vF = _mm256_max_epi32(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 4);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 4);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vFt, vF),
                    _mm256_cmpeq_epi32(vFt, vF));
            vF = _mm256_max_epi32(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vFM = _mm256_slli_si256_rpl(vFM, 4);
        vFS = _mm256_slli_si256_rpl(vFS, 4);
        vFL = _mm256_slli_si256_rpl(vFL, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi32(vF, vHt);
        vH = _mm256_max_epi32(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi32(vH, vGapO);
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi32(vFL, vOne);
            vH = _mm256_max_epi32(vHp, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            case1 = _mm256_cmpeq_epi32(vH, vHp);
            case2 = _mm256_cmpeq_epi32(vH, vF);
            case0 = _mm256_cmpeq_epi32(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi32(vH, vMaxH);
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t *m = (int32_t*)pvHMMax;
        int32_t *s = (int32_t*)pvHSMax;
        int32_t *l = (int32_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}